

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToLastOne_Test::
~TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToLastOne_Test
          (TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToLastOne_Test *this)

{
  TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToLastOne_Test *this_local;
  
  ~TEST_MockExpectedCallsList_removeAllExpectationsExceptThisThatRelateToLastOne_Test(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(MockExpectedCallsList, removeAllExpectationsExceptThisThatRelateToLastOne)
{
    call1->withName("unrelate");
    call2->withName("relate");
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->onlyKeepExpectationsRelatedTo("unrelate");
    LONGS_EQUAL(1, list->size());
}